

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

void __thiscall pbrt::SquareMatrix<4>::SquareMatrix(SquareMatrix<4> *this)

{
  Float aFVar1 [4];
  undefined1 auVar2 [32];
  ulong uVar3;
  int i;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  lVar4 = 0;
  do {
    auVar5 = vpbroadcastq_avx512vl();
    lVar4 = lVar4 + 1;
    uVar3 = vpcmpeqq_avx512vl(auVar5,auVar2);
    auVar6 = vpmovm2d_avx512vl(uVar3 & 0xf);
    auVar6 = vpsrld_avx(auVar6,0x1f);
    aFVar1 = (Float  [4])vcvtdq2ps_avx(auVar6);
    *(Float (*) [4])this = aFVar1;
    this = (SquareMatrix<4> *)((long)this + 0x10);
  } while (lVar4 != 4);
  return;
}

Assistant:

PBRT_CPU_GPU
    SquareMatrix() {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m[i][j] = (i == j) ? 1 : 0;
    }